

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::createMaterialFrom(SemanticParser *this,SP *in)

{
  ParamSet *this_00;
  _Base_ptr p_Var1;
  int iVar2;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  char *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  SP SVar5;
  string type;
  string local_128;
  long local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  long local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  long local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  long local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  long local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  long local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  long local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  long local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48;
  
  if (*in_RDX == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"warning: empty material!",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var3._M_pi = extraout_RDX;
    goto LAB_00140179;
  }
  iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x40));
  this_00 = (ParamSet *)*in_RDX;
  if (iVar2 == 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"type","");
    syntactic::ParamSet::getParamString(&local_128,this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    p_Var1 = this_00[1].param._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,p_Var1,
               (long)&p_Var1->_M_color +
               (long)&(this_00[1].param._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                      _M_color);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_128);
  if (iVar2 == 0) {
    std::__shared_ptr<pbrt::Material,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pbrt::Material>>
              ((__shared_ptr<pbrt::Material,(__gnu_cxx::_Lock_policy)2> *)this,
               (allocator<pbrt::Material> *)&local_48);
    _Var3._M_pi = extraout_RDX_01;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_128);
    if (iVar2 == 0) {
      local_58 = *in_RDX;
      local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_50->_M_use_count = local_50->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_50->_M_use_count = local_50->_M_use_count + 1;
        }
      }
      SVar5 = createMaterial_plastic(this,in);
      _Var3 = SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      this_01 = local_50;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_128);
      if (iVar2 == 0) {
        local_68 = *in_RDX;
        local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
        if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_60->_M_use_count = local_60->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_60->_M_use_count = local_60->_M_use_count + 1;
          }
        }
        SVar5 = createMaterial_matte(this,in);
        _Var3 = SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
        this_01 = local_60;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_128);
        if (iVar2 == 0) {
          local_78 = *in_RDX;
          local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
          if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_70->_M_use_count = local_70->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_70->_M_use_count = local_70->_M_use_count + 1;
            }
          }
          SVar5 = createMaterial_metal(this,in);
          _Var3 = SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
          this_01 = local_70;
        }
        else {
          pcVar4 = "fourier";
          iVar2 = std::__cxx11::string::compare((char *)&local_128);
          if (iVar2 == 0) {
            local_88 = *in_RDX;
            local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
            if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_80->_M_use_count = local_80->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_80->_M_use_count = local_80->_M_use_count + 1;
              }
            }
            SVar5 = createMaterial_fourier(this,(SP *)pcVar4);
            _Var3 = SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi;
            this_01 = local_80;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_128);
            if (iVar2 == 0) {
              local_98 = *in_RDX;
              local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
              if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_90->_M_use_count = local_90->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_90->_M_use_count = local_90->_M_use_count + 1;
                }
              }
              SVar5 = createMaterial_mirror(this,in);
              _Var3 = SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
              this_01 = local_90;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_128);
              if (iVar2 == 0) {
                local_a8 = *in_RDX;
                local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_a0->_M_use_count = local_a0->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_a0->_M_use_count = local_a0->_M_use_count + 1;
                  }
                }
                SVar5 = createMaterial_uber(this,in);
                _Var3 = SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
                this_01 = local_a0;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_128);
                if (iVar2 == 0) {
                  local_b8 = *in_RDX;
                  local_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      local_b0->_M_use_count = local_b0->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      local_b0->_M_use_count = local_b0->_M_use_count + 1;
                    }
                  }
                  SVar5 = createMaterial_substrate(this,in);
                  _Var3 = SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                  this_01 = local_b0;
                }
                else {
                  pcVar4 = "disney";
                  iVar2 = std::__cxx11::string::compare((char *)&local_128);
                  if (iVar2 == 0) {
                    local_c8 = *in_RDX;
                    local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        local_c0->_M_use_count = local_c0->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        local_c0->_M_use_count = local_c0->_M_use_count + 1;
                      }
                    }
                    SVar5 = createMaterial_disney(this,(SP *)pcVar4);
                    _Var3 = SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                    this_01 = local_c0;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)&local_128);
                    if (iVar2 == 0) {
                      local_d8 = *in_RDX;
                      local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          local_d0->_M_use_count = local_d0->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          local_d0->_M_use_count = local_d0->_M_use_count + 1;
                        }
                      }
                      SVar5 = createMaterial_mix(this,in);
                      _Var3 = SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                      this_01 = local_d0;
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)&local_128);
                      if (iVar2 == 0) {
                        local_e8 = *in_RDX;
                        local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                        if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_e0->_M_use_count = local_e0->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_e0->_M_use_count = local_e0->_M_use_count + 1;
                          }
                        }
                        SVar5 = createMaterial_translucent(this,in);
                        _Var3 = SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                        this_01 = local_e0;
                      }
                      else {
                        pcVar4 = "glass";
                        iVar2 = std::__cxx11::string::compare((char *)&local_128);
                        if (iVar2 == 0) {
                          local_f8 = *in_RDX;
                          local_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                          if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              local_f0->_M_use_count = local_f0->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              local_f0->_M_use_count = local_f0->_M_use_count + 1;
                            }
                          }
                          SVar5 = createMaterial_glass(this,(SP *)pcVar4);
                          _Var3 = SVar5.
                                  super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                          this_01 = local_f0;
                        }
                        else {
                          pcVar4 = "hair";
                          iVar2 = std::__cxx11::string::compare((char *)&local_128);
                          if (iVar2 != 0) {
                            std::__shared_ptr<pbrt::Material,(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr<std::allocator<pbrt::Material>>
                                      ((__shared_ptr<pbrt::Material,(__gnu_cxx::_Lock_policy)2> *)
                                       this,(allocator<pbrt::Material> *)&local_48);
                            _Var3._M_pi = extraout_RDX_00;
                            goto LAB_0014015e;
                          }
                          local_108 = *in_RDX;
                          local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
                          if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              local_100->_M_use_count = local_100->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              local_100->_M_use_count = local_100->_M_use_count + 1;
                            }
                          }
                          SVar5 = createMaterial_hair(this,(SP *)pcVar4);
                          _Var3 = SVar5.
                                  super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                          this_01 = local_100;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      _Var3._M_pi = extraout_RDX_02;
    }
  }
LAB_0014015e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX_03;
  }
LAB_00140179:
  SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SP)SVar5.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterialFrom(pbrt::syntactic::Material::SP in)
  {
    if (!in) {
      std::cerr << "warning: empty material!" << std::endl;
      return Material::SP();
    }
      
    const std::string type = in->type=="" ? in->getParamString("type") : in->type;

    // ==================================================================
    if (type == "") 
      return std::make_shared<Material>();
        
    // ==================================================================
    if (type == "plastic") 
      return createMaterial_plastic(in);
      
    // ==================================================================
    if (type == "matte")
      return createMaterial_matte(in);
      
    // ==================================================================
    if (type == "metal") 
      return createMaterial_metal(in);
      
    // ==================================================================
    if (type == "fourier") 
      return createMaterial_fourier(in);
      
    // ==================================================================
    if (type == "mirror") 
      return createMaterial_mirror(in);
      
    // ==================================================================
    if (type == "uber") 
      return createMaterial_uber(in);
      
    // ==================================================================
    if (type == "substrate") 
      return createMaterial_substrate(in);
      
    // ==================================================================
    if (type == "disney") 
      return createMaterial_disney(in);

    // ==================================================================
    if (type == "mix")
      return createMaterial_mix(in);

    // ==================================================================
    if (type == "translucent")
      return createMaterial_translucent(in);

    // ==================================================================
    if (type == "glass") 
      return createMaterial_glass(in);

    // ==================================================================
    if (type == "hair") 
      return createMaterial_hair(in);

    // ==================================================================
#ifndef NDEBUG
    std::cout << "Warning: un-recognizd material type '"+type+"'" << std::endl;
#endif
    return std::make_shared<Material>();
  }